

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::DuplicateNameDetector::check
          (DuplicateNameDetector *this,Reader nestedDecls,Which parentKind)

{
  Reader nestedDecls_00;
  Reader nestedDecls_01;
  Reader exp;
  ListElementCount LVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Which WVar4;
  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_> _Var5;
  void *pvVar6;
  _func_int **pp_Var7;
  ushort uVar8;
  undefined2 uVar9;
  WirePointer WVar10;
  ulong uVar11;
  char (*extraout_RDX) [25];
  char (*extraout_RDX_00) [25];
  char (*params) [25];
  uint uVar12;
  ulong uVar13;
  ErrorReporter *pEVar14;
  WirePointer *in_R8;
  WirePointer *pWVar15;
  WirePointer *pWVar16;
  ElementCount index;
  int iVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_bool>
  pVar18;
  Reader RVar19;
  StringPtr SVar20;
  Reader nameText;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Reader decl;
  Reader name;
  Fault f;
  ArrayPtr<const_char> local_188;
  undefined1 local_178 [16];
  WirePointer local_168;
  WirePointer *pWStack_160;
  undefined8 local_158;
  WirePointer *pWStack_150;
  undefined8 local_148;
  StructReader local_138;
  WirePointer local_108;
  WirePointer *in_stack_ffffffffffffff00;
  WirePointer *in_stack_ffffffffffffff08;
  WireValue<uint32_t>_conflict in_stack_ffffffffffffff10;
  anon_union_4_5_35ddcec3_for_WirePointer_1 in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  StructPointerCount in_stack_ffffffffffffff1c;
  undefined2 in_stack_ffffffffffffff1e;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
  *this_00;
  Fault local_d0;
  uint local_c4;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  LVar1 = nestedDecls.reader.elementCount;
  if (nestedDecls.reader.elementCount != 0) {
    this_00 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
               *)&this->names;
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_138,&nestedDecls.reader,index);
      local_178._8_8_ = local_138.capTable;
      local_168 = (WirePointer)local_138.pointers;
      local_178._0_8_ = local_138.segment;
      uVar12 = local_138.nestingLimit;
      if (local_138.pointerCount == 0) {
        local_168.offsetAndKind.value = 0;
        local_168.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_178._0_4_ = 0;
        local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_178._8_8_ = (WirePointer *)0x0;
        uVar12 = 0x7fffffff;
      }
      pWStack_160._0_4_ = uVar12;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_108,(PointerReader *)local_178,(word *)0x0);
      local_168.offsetAndKind.value = 0;
      local_168.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      local_178._0_4_ = 0;
      local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      local_178._8_8_ = (WirePointer *)0x0;
      iVar17 = 0x7fffffff;
      if (in_stack_ffffffffffffff1c != 0) {
        local_168.field_1.upper32Bits = in_stack_ffffffffffffff14.upper32Bits;
        local_168.offsetAndKind.value = in_stack_ffffffffffffff10.value;
        local_178._8_8_ = in_stack_ffffffffffffff00;
        local_178._0_8_ = local_108;
        iVar17 = in_stack_ffffffffffffff20;
      }
      pWStack_160 = (WirePointer *)CONCAT44(pWStack_160._4_4_,iVar17);
      local_188 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)local_178,(void *)0x0,0);
      local_158 = in_stack_ffffffffffffff08;
      pWStack_160 = in_stack_ffffffffffffff00;
      local_178._0_8_ = local_188.ptr;
      local_178._8_8_ = local_188.size_;
      pWStack_150 = (WirePointer *)
                    CONCAT44(in_stack_ffffffffffffff14.upper32Bits,in_stack_ffffffffffffff10.value);
      local_148._4_2_ = in_stack_ffffffffffffff1c;
      local_148._0_4_ = in_stack_ffffffffffffff18;
      local_148._6_2_ = in_stack_ffffffffffffff1e;
      local_168 = local_108;
      in_stack_ffffffffffffff00 = pWStack_160;
      in_stack_ffffffffffffff08 = local_158;
      pVar18 = std::
               _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
               ::
               _M_emplace_unique<std::pair<capnp::Text::Reader,capnp::compiler::LocatedText::Reader>>
                         (this_00,(pair<capnp::Text::Reader,_capnp::compiler::LocatedText::Reader> *
                                  )local_178);
      _Var5 = pVar18.first._M_node;
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (((local_188.size_ == 1) && (0x1f < local_138.dataSize)) &&
           (*(short *)((long)local_138.data + 2) == 7)) {
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[51]>
                    ((String *)local_178,(kj *)"An unnamed union is already defined in this scope.",
                     pVar18._8_8_);
          WVar10 = (WirePointer)((long)"ab\"cd\\ef\x03" + 9);
          if ((WirePointer *)local_178._8_8_ != (WirePointer *)0x0) {
            WVar10 = (WirePointer)local_178._0_8_;
          }
          uVar11 = 0;
          uVar13 = 0;
          if (0x1f < in_stack_ffffffffffffff18) {
            uVar13 = (ulong)(in_stack_ffffffffffffff08->offsetAndKind).value;
          }
          if (0x3f < in_stack_ffffffffffffff18) {
            uVar11 = (ulong)(in_stack_ffffffffffffff08->field_1).upper32Bits;
          }
          (**pEVar14->_vptr_ErrorReporter)
                    (pEVar14,uVar13,uVar11,WVar10,
                     (undefined1 *)
                     ((long)&((WireValue<uint32_t>_conflict *)local_178._8_8_)->value +
                     (ulong)((WirePointer *)local_178._8_8_ == (WirePointer *)0x0)));
          uVar3 = local_178._8_8_;
          uVar2 = local_178._0_8_;
          params = extraout_RDX;
          if ((WirePointer)local_178._0_8_ != (WirePointer)0x0) {
            local_178._0_4_ = 0;
            local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_178._8_8_ = (WirePointer *)0x0;
            (***(_func_int ***)local_168)(local_168,uVar2,1,uVar3,uVar3);
            params = extraout_RDX_00;
          }
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[25]>((String *)local_178,(kj *)"Previously defined here.",params);
          in_R8 = (WirePointer *)
                  ((long)&((WireValue<uint32_t>_conflict *)local_178._8_8_)->value +
                  (ulong)((WirePointer *)local_178._8_8_ == (WirePointer *)0x0));
          uVar11 = 0;
          uVar13 = 0;
          if (0x1f < *(uint *)&_Var5._M_node[2]._M_left) {
            uVar13 = (ulong)**(uint **)(_Var5._M_node + 2);
          }
          if (0x3f < *(uint *)&_Var5._M_node[2]._M_left) {
            uVar11 = (ulong)*(uint *)(*(long *)(_Var5._M_node + 2) + 4);
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar11);
          pWVar15 = (WirePointer *)local_178._8_8_;
          uVar2 = local_178._0_8_;
          if ((WirePointer)local_178._0_8_ != (WirePointer)0x0) {
            local_178._0_4_ = 0;
            local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_178._8_8_ = (WirePointer *)0x0;
            (***(_func_int ***)local_168)(local_168,uVar2,1);
            in_R8 = pWVar15;
          }
        }
        else {
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[36]>
                    ((String *)local_178,(kj *)0x5a3f37,(char (*) [2])&local_188,
                     (Reader *)"\' is already defined in this scope.",(char (*) [36])in_R8);
          WVar10 = (WirePointer)((long)"ab\"cd\\ef\x03" + 9);
          if ((WirePointer *)local_178._8_8_ != (WirePointer *)0x0) {
            WVar10 = (WirePointer)local_178._0_8_;
          }
          pWVar15 = (WirePointer *)
                    ((long)&((WireValue<uint32_t>_conflict *)local_178._8_8_)->value +
                    (ulong)((WirePointer *)local_178._8_8_ == (WirePointer *)0x0));
          uVar11 = 0;
          uVar13 = 0;
          if (0x1f < in_stack_ffffffffffffff18) {
            uVar13 = (ulong)(in_stack_ffffffffffffff08->offsetAndKind).value;
          }
          if (0x3f < in_stack_ffffffffffffff18) {
            uVar11 = (ulong)(in_stack_ffffffffffffff08->field_1).upper32Bits;
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar11,WVar10);
          pWVar16 = (WirePointer *)local_178._8_8_;
          uVar2 = local_178._0_8_;
          if ((WirePointer)local_178._0_8_ != (WirePointer)0x0) {
            local_178._0_4_ = 0;
            local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_178._8_8_ = (WirePointer *)0x0;
            (***(_func_int ***)local_168)(local_168,uVar2,1,pWVar16,pWVar16,0);
            pWVar15 = pWVar16;
          }
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[27]>
                    ((String *)local_178,(kj *)0x5a3f37,(char (*) [2])&local_188,
                     (Reader *)"\' previously defined here.",(char (*) [27])pWVar15);
          in_R8 = (WirePointer *)
                  ((long)&((WireValue<uint32_t>_conflict *)local_178._8_8_)->value +
                  (ulong)((WirePointer *)local_178._8_8_ == (WirePointer *)0x0));
          uVar11 = 0;
          uVar13 = 0;
          if (0x1f < *(uint *)&_Var5._M_node[2]._M_left) {
            uVar13 = (ulong)**(uint **)(_Var5._M_node + 2);
          }
          if (0x3f < *(uint *)&_Var5._M_node[2]._M_left) {
            uVar11 = (ulong)*(uint *)(*(long *)(_Var5._M_node + 2) + 4);
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar11);
          pWVar15 = (WirePointer *)local_178._8_8_;
          uVar2 = local_178._0_8_;
          if ((WirePointer)local_178._0_8_ != (WirePointer)0x0) {
            local_178._0_4_ = 0;
            local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_178._8_8_ = (WirePointer *)0x0;
            (***(_func_int ***)local_168)(local_168,uVar2,1);
            in_R8 = pWVar15;
          }
        }
      }
      if (local_138.dataSize < 0x20) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)((long)local_138.data + 2);
      }
      if (uVar8 < 0xc) {
        if ((0xdd4U >> (uVar8 & 0x1f) & 1) == 0) {
          if ((0x228U >> (uVar8 & 0x1f) & 1) == 0) {
            if (uVar8 != 1) goto LAB_003d88f0;
            if (local_138.pointerCount < 6) {
              uVar12 = 0x7fffffff;
              local_178._8_8_ = (WirePointer *)0x0;
              local_168.offsetAndKind.value = 0;
              local_168.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
              local_178._0_4_ = 0;
              local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            }
            else {
              local_168 = (WirePointer)((long)local_138.pointers + 0x28);
              local_178._8_8_ = local_138.capTable;
              local_178._0_8_ = local_138.segment;
              uVar12 = local_138.nestingLimit;
            }
            pWStack_160 = (WirePointer *)CONCAT44(pWStack_160._4_4_,uVar12);
            capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)local_178,(word *)0x0);
            exp._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff08;
            exp._reader.segment = (SegmentReader *)in_stack_ffffffffffffff00;
            exp._reader.data._0_4_ = in_stack_ffffffffffffff10.value;
            exp._reader.data._4_4_ = in_stack_ffffffffffffff14.upper32Bits;
            exp._reader.pointers._0_4_ = in_stack_ffffffffffffff18;
            exp._reader.pointers._4_2_ = in_stack_ffffffffffffff1c;
            exp._reader.pointers._6_2_ = in_stack_ffffffffffffff1e;
            exp._reader.dataSize = in_stack_ffffffffffffff20;
            exp._reader.pointerCount = (short)in_stack_ffffffffffffff24;
            exp._reader._38_2_ = SUB42(in_stack_ffffffffffffff24,2);
            exp._reader._40_8_ = this_00;
            SVar20 = getExpressionTargetName(exp);
            if ((SVar20.content.size_ != 1) && ((byte)(*SVar20.content.ptr + 0x9fU) < 0x1a))
            goto LAB_003d87e0;
          }
          if ((local_188.size_ != 1) && ((byte)(*local_188.ptr + 0xa5U) < 0xe6)) {
            uVar11 = 0;
            uVar13 = 0;
            if (0x1f < in_stack_ffffffffffffff18) {
              uVar13 = (ulong)(in_stack_ffffffffffffff08->offsetAndKind).value;
            }
            if (0x3f < in_stack_ffffffffffffff18) {
              uVar11 = (ulong)(in_stack_ffffffffffffff08->field_1).upper32Bits;
            }
            pEVar14 = this->errorReporter;
            pp_Var7 = pEVar14->_vptr_ErrorReporter;
            in_R8 = (WirePointer *)0x2d;
            goto LAB_003d88b0;
          }
        }
        else {
LAB_003d87e0:
          if ((local_188.size_ != 1) && ((byte)(*local_188.ptr + 0x85U) < 0xe6)) {
            uVar11 = 0;
            uVar13 = 0;
            if (0x1f < in_stack_ffffffffffffff18) {
              uVar13 = (ulong)(in_stack_ffffffffffffff08->offsetAndKind).value;
            }
            if (0x3f < in_stack_ffffffffffffff18) {
              uVar11 = (ulong)(in_stack_ffffffffffffff08->field_1).upper32Bits;
            }
            pEVar14 = this->errorReporter;
            pp_Var7 = pEVar14->_vptr_ErrorReporter;
            in_R8 = (WirePointer *)&DAT_00000034;
LAB_003d88b0:
            (**pp_Var7)(pEVar14,uVar13,uVar11);
          }
        }
      }
      else {
LAB_003d88f0:
        local_178._0_8_ = local_188.size_ - 1;
        local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
        local_168 = (WirePointer)0x4fd0ae;
        pWStack_160 = (WirePointer *)&DAT_00000005;
        local_158 = (WirePointer *)
                    CONCAT71(local_158._1_7_,(WirePointer)local_178._0_8_ == (WirePointer)0x0);
        if ((WirePointer)local_178._0_8_ != (WirePointer)0x0) {
          local_c4 = 0;
          if (0x1f < local_138.dataSize) {
            local_c4 = (uint)*(ushort *)((long)local_138.data + 2);
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[55],unsigned_int>
                    (&local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x314,FAILED,"nameText.size() == 0",
                     "_kjCondition,\"Don\'t know what naming rules to enforce for node type.\", (uint)decl.which()"
                     ,(DebugComparison<unsigned_long,_int> *)local_178,
                     (char (*) [55])"Don\'t know what naming rules to enforce for node type.",
                     &local_c4);
          kj::_::Debug::Fault::fatal(&local_d0);
        }
      }
      pvVar6 = memchr(local_188.ptr,0x5f,local_188.size_ - 1);
      if (pvVar6 != (void *)0x0) {
        uVar11 = 0;
        uVar13 = 0;
        if (0x1f < in_stack_ffffffffffffff18) {
          uVar13 = (ulong)(in_stack_ffffffffffffff08->offsetAndKind).value;
        }
        if (0x3f < in_stack_ffffffffffffff18) {
          uVar11 = (ulong)(in_stack_ffffffffffffff08->field_1).upper32Bits;
        }
        in_R8 = (WirePointer *)0xab;
        (**this->errorReporter->_vptr_ErrorReporter)(this->errorReporter,uVar13,uVar11);
      }
      if (local_138.dataSize < 0x20) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined2 *)((long)local_138.data + 2);
      }
      switch(uVar9) {
      case 1:
      case 2:
      case 3:
      case 5:
      case 9:
      case 0xb:
        if ((INTERFACE < parentKind) || ((0x221U >> (parentKind & 0x1f) & 1) == 0))
        goto switchD_003d89bc_default;
        break;
      case 4:
        if (parentKind != ENUM) {
          uVar11 = 0;
          uVar13 = 0;
          if (0x3f < local_138.dataSize) {
            uVar13 = (ulong)*(uint *)((long)local_138.data + 4);
          }
          if (0x5f < local_138.dataSize) {
            uVar11 = (ulong)*(uint *)((long)local_138.data + 8);
          }
          pEVar14 = this->errorReporter;
          pp_Var7 = pEVar14->_vptr_ErrorReporter;
          in_R8 = (WirePointer *)0x25;
          goto LAB_003d8a16;
        }
        break;
      case 6:
      case 7:
      case 8:
        if ((GROUP < parentKind) || ((0x1a0U >> (parentKind & 0x1f) & 1) == 0)) {
          uVar11 = 0;
          uVar13 = 0;
          if (0x3f < local_138.dataSize) {
            uVar13 = (ulong)*(uint *)((long)local_138.data + 4);
          }
          if (0x5f < local_138.dataSize) {
            uVar11 = (ulong)*(uint *)((long)local_138.data + 8);
          }
          in_R8 = (WirePointer *)0x2d;
          (**this->errorReporter->_vptr_ErrorReporter)(this->errorReporter,uVar13,uVar11);
        }
        local_108 = (WirePointer)local_138.segment;
        if (local_138.pointerCount == 0) {
          local_108.offsetAndKind.value = 0;
          local_108.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        capnp::_::PointerReader::getStruct
                  ((StructReader *)local_178,(PointerReader *)&local_108,(word *)0x0);
        local_108.offsetAndKind.value = 0;
        local_108.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        in_stack_ffffffffffffff00 = (WirePointer *)0x0;
        in_stack_ffffffffffffff08 = (WirePointer *)0x0;
        in_stack_ffffffffffffff10.value = 0x7fffffff;
        if (local_158._4_2_ != 0) {
          in_stack_ffffffffffffff00 = (WirePointer *)local_178._8_8_;
          in_stack_ffffffffffffff08 = pWStack_160;
          local_108 = (WirePointer)local_178._0_8_;
          in_stack_ffffffffffffff10.value = (uint)pWStack_150;
        }
        RVar19 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_108,(void *)0x0,0);
        if (RVar19.super_StringPtr.content.size_ == 1) {
          if (local_138.pointerCount < 3) {
            uVar12 = 0x7fffffff;
            local_178._8_8_ = (WirePointer *)0x0;
            local_168.offsetAndKind.value = 0;
            local_168.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_178._0_4_ = 0;
            local_178._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            local_168 = (WirePointer)((long)local_138.pointers + 0x10);
            local_178._8_8_ = local_138.capTable;
            local_178._0_8_ = local_138.segment;
            uVar12 = local_138.nestingLimit;
          }
          pWStack_160 = (WirePointer *)CONCAT44(pWStack_160._4_4_,uVar12);
          WVar4 = FILE;
          capnp::_::PointerReader::getList
                    (&local_90,(PointerReader *)local_178,INLINE_COMPOSITE,(word *)0x0);
          if (0x1f < local_138.dataSize) {
            WVar4 = *(Which *)((long)local_138.data + 2);
          }
          nestedDecls_00.reader.capTable = local_90.capTable;
          nestedDecls_00.reader.segment = local_90.segment;
          nestedDecls_00.reader.ptr = local_90.ptr;
          nestedDecls_00.reader.elementCount = local_90.elementCount;
          nestedDecls_00.reader.step = local_90.step;
          nestedDecls_00.reader.structDataSize = local_90.structDataSize;
          nestedDecls_00.reader.structPointerCount = local_90.structPointerCount;
          nestedDecls_00.reader.elementSize = local_90.elementSize;
          nestedDecls_00.reader._39_1_ = local_90._39_1_;
          nestedDecls_00.reader.nestingLimit = local_90.nestingLimit;
          nestedDecls_00.reader._44_4_ = local_90._44_4_;
          check(this,nestedDecls_00,WVar4);
        }
        else {
          local_178._0_8_ = this->errorReporter;
          local_168 = (WirePointer)((ulong)local_168 & 0xffffffff00000000);
          pWStack_160 = (WirePointer *)0x0;
          local_158 = &local_168;
          local_148._0_4_ = 0;
          local_148._4_2_ = 0;
          local_148._6_2_ = 0;
          in_stack_ffffffffffffff08 = (WirePointer *)0x0;
          local_108.offsetAndKind.value = 0;
          local_108.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          in_stack_ffffffffffffff00 = (WirePointer *)0x0;
          in_stack_ffffffffffffff10.value = 0x7fffffff;
          if (2 < local_138.pointerCount) {
            in_stack_ffffffffffffff08 = (WirePointer *)((long)local_138.pointers + 0x10);
            in_stack_ffffffffffffff00 = (WirePointer *)local_138.capTable;
            local_108 = (WirePointer)local_138.segment;
            in_stack_ffffffffffffff10.value = local_138.nestingLimit;
          }
          pWStack_150 = local_158;
          capnp::_::PointerReader::getList
                    (&local_c0,(PointerReader *)&local_108,INLINE_COMPOSITE,(word *)0x0);
          if (local_138.dataSize < 0x20) {
            WVar4 = FILE;
          }
          else {
            WVar4 = *(Which *)((long)local_138.data + 2);
          }
          nestedDecls_01.reader.capTable = local_c0.capTable;
          nestedDecls_01.reader.segment = local_c0.segment;
          nestedDecls_01.reader.ptr = local_c0.ptr;
          nestedDecls_01.reader.elementCount = local_c0.elementCount;
          nestedDecls_01.reader.step = local_c0.step;
          nestedDecls_01.reader.structDataSize = local_c0.structDataSize;
          nestedDecls_01.reader.structPointerCount = local_c0.structPointerCount;
          nestedDecls_01.reader.elementSize = local_c0.elementSize;
          nestedDecls_01.reader._39_1_ = local_c0._39_1_;
          nestedDecls_01.reader.nestingLimit = local_c0.nestingLimit;
          nestedDecls_01.reader._44_4_ = local_c0._44_4_;
          check((DuplicateNameDetector *)local_178,nestedDecls_01,WVar4);
          std::
          _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
          ::~_Rb_tree((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
                       *)(local_178 + 8));
        }
        break;
      case 10:
        if (parentKind != INTERFACE) {
          uVar11 = 0;
          uVar13 = 0;
          if (0x3f < local_138.dataSize) {
            uVar13 = (ulong)*(uint *)((long)local_138.data + 4);
          }
          if (0x5f < local_138.dataSize) {
            uVar11 = (ulong)*(uint *)((long)local_138.data + 8);
          }
          pEVar14 = this->errorReporter;
          pp_Var7 = pEVar14->_vptr_ErrorReporter;
          in_R8 = (WirePointer *)0x27;
          goto LAB_003d8a16;
        }
        break;
      default:
switchD_003d89bc_default:
        uVar11 = 0;
        uVar13 = 0;
        if (0x3f < local_138.dataSize) {
          uVar13 = (ulong)*(uint *)((long)local_138.data + 4);
        }
        if (0x5f < local_138.dataSize) {
          uVar11 = (ulong)*(uint *)((long)local_138.data + 8);
        }
        pEVar14 = this->errorReporter;
        pp_Var7 = pEVar14->_vptr_ErrorReporter;
        in_R8 = (WirePointer *)0x2e;
LAB_003d8a16:
        (**pp_Var7)(pEVar14,uVar13,uVar11);
      }
      index = index + 1;
    } while (LVar1 != index);
  }
  return;
}

Assistant:

void NodeTranslator::DuplicateNameDetector::check(
    List<Declaration>::Reader nestedDecls, Declaration::Which parentKind) {
  for (auto decl: nestedDecls) {
    {
      auto name = decl.getName();
      auto nameText = name.getValue();
      auto insertResult = names.insert(std::make_pair(nameText, name));
      if (!insertResult.second) {
        if (nameText.size() == 0 && decl.isUnion()) {
          errorReporter.addErrorOn(
              name, kj::str("An unnamed union is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("Previously defined here."));
        } else {
          errorReporter.addErrorOn(
              name, kj::str("'", nameText, "' is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("'", nameText, "' previously defined here."));
        }
      }

      switch (decl.which()) {
        case Declaration::USING: {
          kj::StringPtr targetName = getExpressionTargetName(decl.getUsing().getTarget());
          if (targetName.size() > 0 && targetName[0] >= 'a' && targetName[0] <= 'z') {
            // Target starts with lower-case letter, so alias should too.
            if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
              errorReporter.addErrorOn(name,
                  "Non-type names must begin with a lower-case letter.");
            }
          } else {
            // Target starts with capital or is not named (probably, an import). Require
            // capitalization.
            if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
              errorReporter.addErrorOn(name,
                  "Type names must begin with a capital letter.");
            }
          }
          break;
        }

        case Declaration::ENUM:
        case Declaration::STRUCT:
        case Declaration::INTERFACE:
          if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
            errorReporter.addErrorOn(name,
                "Type names must begin with a capital letter.");
          }
          break;

        case Declaration::CONST:
        case Declaration::ANNOTATION:
        case Declaration::ENUMERANT:
        case Declaration::METHOD:
        case Declaration::FIELD:
        case Declaration::UNION:
        case Declaration::GROUP:
          if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
            errorReporter.addErrorOn(name,
                "Non-type names must begin with a lower-case letter.");
          }
          break;

        default:
          KJ_ASSERT(nameText.size() == 0, "Don't know what naming rules to enforce for node type.",
                    (uint)decl.which());
          break;
      }

      if (nameText.findFirst('_') != kj::none) {
        errorReporter.addErrorOn(name,
            "Cap'n Proto declaration names should use camelCase and must not contain "
            "underscores. (Code generators may convert names to the appropriate style for the "
            "target language.)");
      }
    }

    switch (decl.which()) {
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUM:
      case Declaration::STRUCT:
      case Declaration::INTERFACE:
      case Declaration::ANNOTATION:
        switch (parentKind) {
          case Declaration::FILE:
          case Declaration::STRUCT:
          case Declaration::INTERFACE:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
            break;
        }
        break;

      case Declaration::ENUMERANT:
        if (parentKind != Declaration::ENUM) {
          errorReporter.addErrorOn(decl, "Enumerants can only appear in enums.");
        }
        break;
      case Declaration::METHOD:
        if (parentKind != Declaration::INTERFACE) {
          errorReporter.addErrorOn(decl, "Methods can only appear in interfaces.");
        }
        break;
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
        switch (parentKind) {
          case Declaration::STRUCT:
          case Declaration::UNION:
          case Declaration::GROUP:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This declaration can only appear in structs.");
            break;
        }

        // Struct members may have nested decls.  We need to check those here, because no one else
        // is going to do it.
        if (decl.getName().getValue().size() == 0) {
          // Unnamed union.  Check members as if they are in the same scope.
          check(decl.getNestedDecls(), decl.which());
        } else {
          // Children are in their own scope.
          DuplicateNameDetector(errorReporter)
              .check(decl.getNestedDecls(), decl.which());
        }

        break;

      default:
        errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
        break;
    }
  }
}